

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O2

Image * MakeLightImage(Image *__return_storage_ptr__,Point2i res)

{
  int iVar1;
  Allocator alloc;
  int x;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  float fVar8;
  undefined1 auVar9 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> values;
  allocator<char> local_bb;
  allocator<char> local_ba;
  allocator<char> local_b9;
  Image *local_b8;
  float local_ac;
  ulong local_a8;
  ulong local_a0;
  ColorEncodingHandle local_98;
  undefined1 local_90 [8];
  float local_88;
  string local_70 [32];
  string local_50 [32];
  
  local_b8 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"R",&local_b9);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"G",&local_ba);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"B",&local_bb);
  local_98.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
  pbrt::Image::Image(local_b8,Float,res,channels,&local_98,alloc);
  lVar7 = 0x40;
  do {
    std::__cxx11::string::~string((string *)(local_90 + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  uVar2 = res.super_Tuple2<pbrt::Point2,_int>.y;
  uVar5 = res.super_Tuple2<pbrt::Point2,_int>.x;
  lVar7 = 0;
  iVar4 = 0;
  local_ac = (float)(int)(uVar2 * uVar5);
  local_a8 = (ulong)(~((int)uVar2 >> 0x1f) & uVar2);
  for (local_a0 = 0; local_a0 != local_a8; local_a0 = local_a0 + 1) {
    iVar1 = (int)local_a0;
    iVar6 = 0;
    for (uVar3 = 0; (~((int)uVar5 >> 0x1f) & uVar5) != uVar3; uVar3 = uVar3 + 1) {
      fVar8 = 0.0;
      if ((400 < uVar3 || (int)uVar3 - 0x1eU < 0xab) && iVar1 - 0x28U < 0xb5) {
        fVar8 = sinf((float)iVar6 / local_ac);
        auVar9._0_4_ = (float)((double)fVar8 + 0.2);
        auVar9._4_4_ = (int)((ulong)((double)fVar8 + 0.2) >> 0x20);
        auVar9._8_8_ = 0;
        auVar9 = vmaxss_avx(auVar9,ZEXT416(0));
        fVar8 = auVar9._0_4_;
      }
      local_90._0_4_ = fVar8;
      values.n = 3;
      values.ptr = (float *)local_90;
      local_90._4_4_ = local_90._0_4_;
      local_88 = (float)local_90._0_4_;
      pbrt::Image::SetChannels(local_b8,(Point2i)(lVar7 + uVar3),values);
      iVar6 = iVar6 + iVar4;
    }
    iVar4 = iVar4 + 100;
    lVar7 = lVar7 + 0x100000000;
  }
  return local_b8;
}

Assistant:

static Image MakeLightImage(Point2i res) {
    Image image(PixelFormat::Float, res, {"R", "G", "B"});
    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x) {
            Float val = 0;
            if (((x >= 30 && x <= 200) || x > 400) && y >= 40 && y <= 220) {
                val = .2 + std::sin(100 * x * y / Float(res[0] * res[1]));
                val = std::max(Float(0), val);
            }
            image.SetChannels({x, y}, {val, val, val});
        }
    return image;
}